

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::UnitTestImpl::UnshuffleTests(UnitTestImpl *this)

{
  pointer ppTVar1;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0;
      ppTVar1 = (this->test_cases_).
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->test_cases_).
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3);
      uVar2 = uVar2 + 1) {
    TestCase::UnshuffleTests(ppTVar1[uVar2]);
    (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2] = (int)uVar2;
  }
  return;
}

Assistant:

void UnitTestImpl::UnshuffleTests() {
  for (size_t i = 0; i < test_cases_.size(); i++) {
    // Unshuffles the tests in each test case.
    test_cases_[i]->UnshuffleTests();
    // Resets the index of each test case.
    test_case_indices_[i] = static_cast<int>(i);
  }
}